

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_empty.c
# Opt level: O3

void test_read_format_empty(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a;
  archive_entry *ae;
  archive_entry *local_28;
  
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                   ,L'\"',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar1 = archive_read_support_filter_all(a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                   ,L'#',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all(a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                   ,L'$',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  iVar1 = archive_read_open_memory(a,archive,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                   ,L'%',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, archive, 0)",a);
  iVar1 = archive_read_next_header(a,&local_28);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                   ,L'&',(uint)(iVar1 == 1),"ARCHIVE_EOF == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_code(a,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                   ,L'\'',(uint)(iVar1 == 0),"archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE",a);
  iVar1 = archive_format(a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                   ,L'(',(uint)(iVar1 == 0x60000),"archive_format(a) == ARCHIVE_FORMAT_EMPTY",a);
  wVar2 = archive_entry_is_encrypted(local_28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                      ,L')',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                      ,L'*',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_empty.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_empty)
{
	struct archive_entry *ae;
	struct archive *a;
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_open_memory(a, archive, 0));
	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	assertA(archive_filter_code(a, 0) == ARCHIVE_FILTER_NONE);
	assertA(archive_format(a) == ARCHIVE_FORMAT_EMPTY);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}